

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

AuditEvent * __thiscall license::EventRegistry::getLastFailure(EventRegistry *this)

{
  const_reference pvVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference ppVar5;
  pointer paVar6;
  __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
  local_58;
  __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
  local_50;
  const_iterator it;
  AuditEvent *currentLog;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *mostAdvLogIter;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range2;
  AuditEvent *result;
  EventRegistry *this_local;
  
  __range2 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)0x0;
  sVar3 = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::size(&this->logs);
  if (sVar3 == 0) {
    this_local = (EventRegistry *)0x0;
  }
  else {
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::size(&this->mostAdvancedLogIdx_by_LicenseId);
    pvVar1 = (const_reference)__range2;
    if (sVar4 != 0) {
      __end2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::begin(&this->mostAdvancedLogIdx_by_LicenseId);
      mostAdvLogIter =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::end(&this->mostAdvancedLogIdx_by_LicenseId);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&mostAdvLogIter),
            pvVar1 = (const_reference)__range2, bVar2) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator*(&__end2);
        it._M_current =
             std::vector<AuditEvent,_std::allocator<AuditEvent>_>::operator[]
                       (&this->logs,ppVar5->second);
        pvVar1 = it._M_current;
        if ((it._M_current)->severity == SVRT_ERROR) break;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::operator++(&__end2);
      }
    }
    __range2 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)pvVar1;
    if (__range2 ==
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0x0) {
      local_50._M_current =
           (anon_struct_1288_4_4db92441 *)
           std::vector<AuditEvent,_std::allocator<AuditEvent>_>::end(&this->logs);
      do {
        __gnu_cxx::
        __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
        ::operator--(&local_50);
        paVar6 = __gnu_cxx::
                 __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
                 ::operator->(&local_50);
        if (paVar6->severity == SVRT_ERROR) {
          __range2 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)__gnu_cxx::
                        __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
                        ::operator*(&local_50);
          break;
        }
        local_58._M_current =
             (anon_struct_1288_4_4db92441 *)
             std::vector<AuditEvent,_std::allocator<AuditEvent>_>::begin(&this->logs);
        bVar2 = __gnu_cxx::operator!=(&local_50,&local_58);
      } while (bVar2);
    }
    this_local = (EventRegistry *)__range2;
  }
  return (AuditEvent *)this_local;
}

Assistant:

const AuditEvent *EventRegistry::getLastFailure() const {
	const AuditEvent *result = nullptr;
	if (logs.size() == 0) {
		return result;
	}
	// try to find a failure between the licenses who progressed the most
	if (mostAdvancedLogIdx_by_LicenseId.size() > 0) {
		for (const auto &mostAdvLogIter : mostAdvancedLogIdx_by_LicenseId) {
			const AuditEvent &currentLog = logs[mostAdvLogIter.second];
			if (currentLog.severity == SVRT_ERROR) {
				result = &(currentLog);
				break;
			}
		}
	}
	if (result == nullptr) {
		auto it = logs.end();
		do {
			--it;
			if (it->severity == SVRT_ERROR) {
				result = &(*it);
				break;
			}
		} while (it != logs.begin());
	}
	return result;
}